

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * CTcPrsOpUnary::parse_dec(int pre,CTcPrsNode *subexpr)

{
  int iVar1;
  CTcPrsNode *pCVar2;
  undefined *puVar3;
  
  pCVar2 = subexpr;
  iVar1 = (*(subexpr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[3])(subexpr);
  if (iVar1 == 0) {
    pCVar2 = (CTcPrsNode *)CTcTokenizer::get_op_text(TOKT_DEC);
    CTcTokenizer::log_error(0x2afe);
  }
  pCVar2 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x10,(size_t)pCVar2);
  pCVar2[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)subexpr;
  if (pre == 0) {
    puVar3 = &CTPNPostDec::vtable;
  }
  else {
    puVar3 = &CTPNPreDec::vtable;
  }
  (pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)(puVar3 + 0x10);
  return pCVar2;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_dec(int pre, CTcPrsNode *subexpr)
{
    /* require an lvalue */
    if (!subexpr->check_lvalue())
    {
        /* log an error, but continue parsing */
        G_tok->log_error(TCERR_INVALID_UNARY_LVALUE,
                         G_tok->get_op_text(TOKT_DEC));
    }

    /* apply the pre-increment operator */
    if (pre)
        return new CTPNPreDec(subexpr);
    else
        return new CTPNPostDec(subexpr);
}